

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_spawns.cxx
# Opt level: O0

void __thiscall level_tools::reconstruct_spawns(level_tools *this)

{
  float fVar1;
  _Alloc_hider _Var2;
  uint8_t uVar3;
  bool bVar4;
  int iVar5;
  rgba32 rVar6;
  xr_scene_spawns *this_00;
  xr_custom_object_vec *this_01;
  xr_level_spawn *pxVar7;
  vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_> *this_02;
  size_type sVar8;
  reference ppcVar9;
  string *this_03;
  fvector3 *pfVar10;
  uint16_t *puVar11;
  cse_abstract **ppcVar12;
  undefined4 extraout_var;
  xr_shape_object *pxVar13;
  undefined4 extraout_var_00;
  shape_def_vec *__x;
  shape_def_vec *this_04;
  xr_custom_object **ppxVar14;
  xr_level_game *pxVar15;
  mp_rpoint_vec *pmVar16;
  size_type sVar17;
  reference ppmVar18;
  _Alloc_hider *p_Var19;
  uint8_t *puVar20;
  xr_level_env_mod *pxVar21;
  env_mod_data_vec *peVar22;
  reference ppeVar23;
  xr_spawn_object *pxVar24;
  char *pcVar25;
  string *psVar26;
  fvector3 *pfVar27;
  float *pfVar28;
  rgba32 *prVar29;
  xr_spawn_object *local_e0;
  xr_spawn_object *local_d8;
  xr_spawn_object *new_env_mod;
  env_mod_data *env_mod;
  env_mod_data_vec_cit end_2;
  env_mod_data_vec_cit it_2;
  xr_name_gen name_1;
  env_mod_data_vec *env_mods;
  xr_spawn_object *local_98;
  xr_spawn_object *new_rpoint;
  mp_rpoint *rpoint;
  mp_rpoint_vec_cit end_1;
  mp_rpoint_vec_cit it_1;
  xr_name_gen name;
  mp_rpoint_vec *rpoints;
  xr_shape_object *local_58;
  xr_shape_object *new_shape;
  xr_spawn_object *local_40;
  xr_spawn_object *new_spawn;
  cse_abstract *entity;
  xr_entity_vec_it end;
  xr_entity_vec_it it;
  xr_entity_vec *spawns;
  xr_custom_object_vec *cobjects;
  level_tools *this_local;
  
  this_00 = xray_re::xr_scene::spawns(this->m_scene);
  this_01 = xray_re::xr_scene_objects::objects(&this_00->super_xr_scene_objects);
  pxVar7 = xray_re::xr_level::spawn(this->m_level);
  if (pxVar7 != (xr_level_spawn *)0x0) {
    xray_re::msg("building %s (%s)","spawn.part","entities");
    pxVar7 = xray_re::xr_level::spawn(this->m_level);
    this_02 = xray_re::xr_level_spawn::spawns(pxVar7);
    sVar8 = std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::size
                      (this_02);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_01,sVar8);
    end._M_current =
         (cse_abstract **)
         std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::begin
                   (this_02);
    entity = (cse_abstract *)
             std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::end
                       (this_02);
    while (bVar4 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                                    *)&entity), bVar4) {
      ppcVar9 = __gnu_cxx::
                __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                ::operator*(&end);
      new_spawn = (xr_spawn_object *)*ppcVar9;
      if ((cse_abstract *)new_spawn == (cse_abstract *)0x0) {
        __assert_fail("entity",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_spawns.cxx"
                      ,0x1b,"void level_tools::reconstruct_spawns()");
      }
      ppcVar9 = __gnu_cxx::
                __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
                ::operator*(&end);
      *ppcVar9 = (cse_abstract *)0x0;
      pxVar24 = (xr_spawn_object *)operator_new(0x98);
      xray_re::xr_spawn_object::xr_spawn_object(pxVar24,this->m_scene,(char *)0x0);
      local_40 = pxVar24;
      psVar26 = xray_re::cse_abstract::name_replace_abi_cxx11_((cse_abstract *)new_spawn);
      this_03 = xray_re::xr_custom_object::co_name_abi_cxx11_(&local_40->super_xr_custom_object);
      std::__cxx11::string::operator=((string *)this_03,(string *)psVar26);
      pfVar27 = xray_re::cse_abstract::position((cse_abstract *)new_spawn);
      pfVar10 = xray_re::xr_custom_object::co_position(&local_40->super_xr_custom_object);
      *(undefined8 *)&pfVar10->field_0 = *(undefined8 *)&pfVar27->field_0;
      (pfVar10->field_0).field_0.z = (pfVar27->field_0).field_0.z;
      pfVar27 = xray_re::cse_abstract::rotation((cse_abstract *)new_spawn);
      pfVar10 = xray_re::xr_custom_object::co_rotation(&local_40->super_xr_custom_object);
      *(undefined8 *)&pfVar10->field_0 = *(undefined8 *)&pfVar27->field_0;
      (pfVar10->field_0).field_0.z = (pfVar27->field_0).field_0.z;
      if (this->m_spawn_version == 0x76) {
        puVar11 = xray_re::cse_abstract::version((cse_abstract *)new_spawn);
        *puVar11 = 0x76;
        puVar11 = xray_re::cse_abstract::script_version((cse_abstract *)new_spawn);
        *puVar11 = 6;
      }
      else if (this->m_spawn_version == 0x7c) {
        puVar11 = xray_re::cse_abstract::version((cse_abstract *)new_spawn);
        *puVar11 = 0x7c;
        puVar11 = xray_re::cse_abstract::script_version((cse_abstract *)new_spawn);
        *puVar11 = 8;
      }
      else if (this->m_spawn_version == 0x80) {
        puVar11 = xray_re::cse_abstract::version((cse_abstract *)new_spawn);
        *puVar11 = 0x80;
        puVar11 = xray_re::cse_abstract::script_version((cse_abstract *)new_spawn);
        *puVar11 = 0xc;
      }
      pxVar24 = new_spawn;
      ppcVar12 = xray_re::xr_spawn_object::entity(local_40);
      *ppcVar12 = (cse_abstract *)pxVar24;
      iVar5 = (*(new_spawn->super_xr_custom_object)._vptr_xr_custom_object[7])();
      if (CONCAT44(extraout_var,iVar5) != 0) {
        pxVar13 = (xr_shape_object *)operator_new(0x88);
        xray_re::xr_shape_object::xr_shape_object(pxVar13,this->m_scene);
        local_58 = pxVar13;
        psVar26 = xray_re::xr_custom_object::co_name_abi_cxx11_((xr_custom_object *)pxVar13);
        std::__cxx11::string::operator=((string *)psVar26,"shape");
        pfVar27 = xray_re::cse_abstract::position((cse_abstract *)new_spawn);
        pfVar10 = xray_re::xr_custom_object::co_position(&local_58->super_xr_custom_object);
        *(undefined8 *)&pfVar10->field_0 = *(undefined8 *)&pfVar27->field_0;
        (pfVar10->field_0).field_0.z = (pfVar27->field_0).field_0.z;
        pfVar27 = xray_re::cse_abstract::rotation((cse_abstract *)new_spawn);
        pfVar10 = xray_re::xr_custom_object::co_rotation(&local_58->super_xr_custom_object);
        *(undefined8 *)&pfVar10->field_0 = *(undefined8 *)&pfVar27->field_0;
        (pfVar10->field_0).field_0.z = (pfVar27->field_0).field_0.z;
        iVar5 = (*(new_spawn->super_xr_custom_object)._vptr_xr_custom_object[7])();
        __x = xray_re::cse_shape::shapes((cse_shape *)CONCAT44(extraout_var_00,iVar5));
        this_04 = xray_re::xr_shape_object::shapes(local_58);
        std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::operator=(this_04,__x)
        ;
        pxVar13 = local_58;
        ppxVar14 = xray_re::xr_spawn_object::attached_object(local_40);
        *ppxVar14 = &pxVar13->super_xr_custom_object;
      }
      rpoints = (mp_rpoint_vec *)local_40;
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      push_back(this_01,(value_type *)&rpoints);
      __gnu_cxx::
      __normal_iterator<xray_re::cse_abstract_**,_std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>_>
      ::operator++(&end);
    }
    xray_re::xr_level::clear_spawn(this->m_level);
  }
  pxVar15 = xray_re::xr_level::game(this->m_level);
  if (pxVar15 != (xr_level_game *)0x0) {
    pxVar15 = xray_re::xr_level::game(this->m_level);
    pmVar16 = xray_re::xr_level_game::rpoints(pxVar15);
    bVar4 = std::vector<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>::empty(pmVar16)
    ;
    if (!bVar4) {
      xray_re::msg("building %s (%s)","spawn.part","$rpoints");
      pxVar15 = xray_re::xr_level::game(this->m_level);
      pmVar16 = xray_re::xr_level_game::rpoints(pxVar15);
      sVar8 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ::size(this_01);
      sVar17 = std::vector<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>::size
                         (pmVar16);
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      reserve(this_01,sVar8 + sVar17);
      xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it_1,"$rpoint",true);
      end_1._M_current =
           (mp_rpoint **)
           std::vector<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>::begin(pmVar16);
      rpoint = (mp_rpoint *)
               std::vector<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>::end
                         (pmVar16);
      while (bVar4 = __gnu_cxx::operator!=
                               (&end_1,(__normal_iterator<xray_re::mp_rpoint_*const_*,_std::vector<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>_>
                                        *)&rpoint), bVar4) {
        ppmVar18 = __gnu_cxx::
                   __normal_iterator<xray_re::mp_rpoint_*const_*,_std::vector<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>_>
                   ::operator*(&end_1);
        new_rpoint = (xr_spawn_object *)*ppmVar18;
        pxVar24 = (xr_spawn_object *)operator_new(0x98);
        xray_re::xr_spawn_object::xr_spawn_object(pxVar24,this->m_scene,"$rpoint");
        local_98 = pxVar24;
        pcVar25 = xray_re::xr_name_gen::get((xr_name_gen *)&it_1);
        psVar26 = xray_re::xr_custom_object::co_name_abi_cxx11_(&local_98->super_xr_custom_object);
        std::__cxx11::string::operator=((string *)psVar26,pcVar25);
        pfVar27 = xray_re::xr_custom_object::co_position(&local_98->super_xr_custom_object);
        xray_re::_vector3<float>::set<float>(pfVar27,(_vector3<float> *)new_rpoint);
        pfVar27 = xray_re::xr_custom_object::co_rotation(&local_98->super_xr_custom_object);
        xray_re::_vector3<float>::set<float>
                  (pfVar27,(_vector3<float> *)
                           ((long)&(new_rpoint->super_xr_custom_object).m_scene + 4));
        _Var2 = (new_rpoint->super_xr_custom_object).m_name._M_dataplus;
        p_Var19 = (_Alloc_hider *)xray_re::xr_spawn_object::team(local_98);
        *p_Var19 = _Var2;
        uVar3 = (new_rpoint->super_xr_custom_object).m_name.field_0x1;
        puVar20 = xray_re::xr_spawn_object::respawn(local_98);
        *puVar20 = uVar3;
        uVar3 = (new_rpoint->super_xr_custom_object).m_name.field_0x2;
        puVar20 = xray_re::xr_spawn_object::game(local_98);
        *puVar20 = uVar3;
        env_mods = (env_mod_data_vec *)local_98;
        std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
        push_back(this_01,(value_type *)&env_mods);
        __gnu_cxx::
        __normal_iterator<xray_re::mp_rpoint_*const_*,_std::vector<xray_re::mp_rpoint_*,_std::allocator<xray_re::mp_rpoint_*>_>_>
        ::operator++(&end_1);
        xray_re::xr_name_gen::next((xr_name_gen *)&it_1);
      }
      xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it_1);
    }
  }
  pxVar21 = xray_re::xr_level::env_mod(this->m_level);
  if (pxVar21 != (xr_level_env_mod *)0x0) {
    pxVar21 = xray_re::xr_level::env_mod(this->m_level);
    peVar22 = xray_re::xr_level_env_mod::env_mods(pxVar21);
    bVar4 = std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>::empty
                      (peVar22);
    if (!bVar4) {
      xray_re::msg("building %s (%s)","spawn.part","$env_mods");
      pxVar21 = xray_re::xr_level::env_mod(this->m_level);
      peVar22 = xray_re::xr_level_env_mod::env_mods(pxVar21);
      sVar8 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
              ::size(this_01);
      sVar17 = std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>::size
                         (peVar22);
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      reserve(this_01,sVar8 + sVar17);
      xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it_2,"$env_mod",true);
      end_2._M_current =
           (env_mod_data **)
           std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>::begin
                     (peVar22);
      env_mod = (env_mod_data *)
                std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>::end
                          (peVar22);
      while (bVar4 = __gnu_cxx::operator!=
                               (&end_2,(__normal_iterator<xray_re::env_mod_data_*const_*,_std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>_>
                                        *)&env_mod), bVar4) {
        ppeVar23 = __gnu_cxx::
                   __normal_iterator<xray_re::env_mod_data_*const_*,_std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>_>
                   ::operator*(&end_2);
        new_env_mod = (xr_spawn_object *)*ppeVar23;
        pxVar24 = (xr_spawn_object *)operator_new(0x98);
        xray_re::xr_spawn_object::xr_spawn_object(pxVar24,this->m_scene,"$env_mod");
        local_d8 = pxVar24;
        pcVar25 = xray_re::xr_name_gen::get((xr_name_gen *)&it_2);
        psVar26 = xray_re::xr_custom_object::co_name_abi_cxx11_(&local_d8->super_xr_custom_object);
        std::__cxx11::string::operator=((string *)psVar26,pcVar25);
        pxVar24 = new_env_mod;
        pfVar27 = xray_re::xr_custom_object::co_position(&local_d8->super_xr_custom_object);
        (pfVar27->field_0).field_0.z = *(float *)&(pxVar24->super_xr_custom_object).m_scene;
        *(_func_int ***)&pfVar27->field_0 = (pxVar24->super_xr_custom_object)._vptr_xr_custom_object
        ;
        fVar1 = *(float *)((long)&(new_env_mod->super_xr_custom_object).m_scene + 4);
        pfVar28 = xray_re::xr_spawn_object::radius(local_d8);
        *pfVar28 = fVar1;
        fVar1 = (float)(new_env_mod->super_xr_custom_object).m_class_id;
        pfVar28 = xray_re::xr_spawn_object::power(local_d8);
        *pfVar28 = fVar1;
        fVar1 = (float)(new_env_mod->super_xr_custom_object).m_flags;
        pfVar28 = xray_re::xr_spawn_object::view_distance(local_d8);
        *pfVar28 = fVar1;
        rVar6 = to_rgba32((fvector3 *)&(new_env_mod->super_xr_custom_object).m_name);
        prVar29 = xray_re::xr_spawn_object::fog_color(local_d8);
        *prVar29 = rVar6;
        fVar1 = *(float *)((long)&(new_env_mod->super_xr_custom_object).m_name._M_string_length + 4)
        ;
        pfVar28 = xray_re::xr_spawn_object::fog_density(local_d8);
        *pfVar28 = fVar1;
        rVar6 = to_rgba32((fvector3 *)&(new_env_mod->super_xr_custom_object).m_name.field_2);
        prVar29 = xray_re::xr_spawn_object::ambient_color(local_d8);
        *prVar29 = rVar6;
        rVar6 = to_rgba32((fvector3 *)
                          ((long)&(new_env_mod->super_xr_custom_object).m_name.field_2 + 0xc));
        prVar29 = xray_re::xr_spawn_object::sky_color(local_d8);
        *prVar29 = rVar6;
        rVar6 = to_rgba32((fvector3 *)
                          ((long)&(new_env_mod->super_xr_custom_object).m_position.field_0 + 8));
        prVar29 = xray_re::xr_spawn_object::hemi_color(local_d8);
        *prVar29 = rVar6;
        local_e0 = local_d8;
        std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
        push_back(this_01,(value_type *)&local_e0);
        __gnu_cxx::
        __normal_iterator<xray_re::env_mod_data_*const_*,_std::vector<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>_>
        ::operator++(&end_2);
        xray_re::xr_name_gen::next((xr_name_gen *)&it_2);
      }
      xray_re::xr_level::clear_env_mod(this->m_level);
      xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it_2);
    }
  }
  return;
}

Assistant:

void level_tools::reconstruct_spawns()
{
	xr_custom_object_vec& cobjects = m_scene->spawns()->objects();
	if (m_level->spawn()) {
		msg("building %s (%s)", "spawn.part", "entities");

		xr_entity_vec& spawns = m_level->spawn()->spawns();
		cobjects.reserve(spawns.size());

		for (xr_entity_vec_it it = spawns.begin(), end = spawns.end(); it != end; ++it) {
			cse_abstract* entity = *it;
			xr_assert(entity);
			// borrow it as usual with spawns
			*it = 0;
			xr_spawn_object* new_spawn = new xr_spawn_object(*m_scene, 0);
			new_spawn->co_name() = entity->name_replace();
			new_spawn->co_position()= entity->position();
			new_spawn->co_rotation() = entity->rotation();
			if (m_spawn_version == CSE_VERSION_SOC)
			{
			entity->version() = CSE_VERSION_SOC;
			entity->script_version() = 6;
			}
			else if (m_spawn_version == CSE_VERSION_CS)
			{
				entity->version() = CSE_VERSION_CS;
				entity->script_version() = 8;
			}
			else if (m_spawn_version == CSE_VERSION_COP)
			{
				entity->version() = CSE_VERSION_COP;
				entity->script_version() = 12;
			}

			new_spawn->entity() = entity;
			if (entity->shape()) {
				xr_shape_object* new_shape = new xr_shape_object(*m_scene);
				new_shape->co_name() = "shape";
				new_shape->co_position()= entity->position();
				new_shape->co_rotation() = entity->rotation();
				new_shape->shapes() = entity->shape()->shapes();
				new_spawn->attached_object() = new_shape;
			}
			cobjects.push_back(new_spawn);
		}
		m_level->clear_spawn();
	}
	if (m_level->game() && !m_level->game()->rpoints().empty()) {
		msg("building %s (%s)", "spawn.part", "$rpoints");

		const mp_rpoint_vec& rpoints = m_level->game()->rpoints();
		cobjects.reserve(cobjects.size() + rpoints.size());

		xr_name_gen name("$rpoint");
		for (mp_rpoint_vec_cit it = rpoints.begin(), end = rpoints.end(); it != end; ++it, name.next()) {
			const mp_rpoint* rpoint = *it;
			xr_spawn_object* new_rpoint = new xr_spawn_object(*m_scene, "$rpoint");
			new_rpoint->co_name() = name.get();
			new_rpoint->co_position().set(rpoint->p);
			new_rpoint->co_rotation().set(rpoint->a);
			new_rpoint->team() = rpoint->team;
			new_rpoint->respawn() = rpoint->respawn;
			new_rpoint->game() = rpoint->game;
			cobjects.push_back(new_rpoint);
		}
	}
	if (m_level->env_mod() && !m_level->env_mod()->env_mods().empty()) {
		msg("building %s (%s)", "spawn.part", "$env_mods");

		const env_mod_data_vec& env_mods = m_level->env_mod()->env_mods();
		cobjects.reserve(cobjects.size() + env_mods.size());

		xr_name_gen name("$env_mod");
		for (env_mod_data_vec_cit it = env_mods.begin(), end = env_mods.end();
				it != end; ++it, name.next()) {
			const env_mod_data* env_mod = *it;
			xr_spawn_object* new_env_mod = new xr_spawn_object(*m_scene, "$env_mod");
			new_env_mod->co_name() = name.get();
			new_env_mod->co_position() = env_mod->position;
			new_env_mod->radius() = env_mod->radius;
			new_env_mod->power() = env_mod->power;
			new_env_mod->view_distance() = env_mod->far_plane;
			new_env_mod->fog_color() = to_rgba32(env_mod->fog_color);
			new_env_mod->fog_density() = env_mod->fog_density;
			new_env_mod->ambient_color() = to_rgba32(env_mod->ambient_color);
			new_env_mod->sky_color() = to_rgba32(env_mod->sky_color);
			new_env_mod->hemi_color() = to_rgba32(env_mod->hemi_color);
			cobjects.push_back(new_env_mod);
		}
		m_level->clear_env_mod();
	}
}